

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O2

void __thiscall xLearn::AccMetricTest_acc_test_Test::TestBody(AccMetricTest_acc_test_Test *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ThreadPool *this_00;
  char *pcVar3;
  undefined1 auVar4 [16];
  AssertHelper local_a0;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AccMetric metric;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> Y;
  
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0xbf800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0xbf800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x42c80000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x42000000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x41400000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0xc1a80000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric = (_func_int **)&PTR__Metric_00170a38;
  metric.total_example_ = 0;
  metric.true_pred_ = 0;
  uVar2 = std::thread::hardware_concurrency();
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar2);
  Metric::Initialize(&metric.super_Metric,this_00);
  AccMetric::Accumulate(&metric,&Y,&pred);
  auVar1._8_8_ = 0;
  auVar1._0_4_ = metric.total_example_;
  auVar1._4_4_ = metric.true_pred_;
  auVar4 = vcvtudq2pd_avx512vl(auVar1);
  auVar1 = vshufpd_avx(auVar4,auVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"metric_val","(3.0 / 4.0)",(float)(auVar1._0_8_ / auVar4._0_8_),
             0.75);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  metric.total_example_ = 0;
  metric.true_pred_ = 0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[0] =
       1.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[1] =
       -1.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[2] =
       -1.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[3] =
       1.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[0]
       = 12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[3]
       = -12.0;
  AccMetric::Accumulate(&metric,&Y,&pred);
  auVar4._8_8_ = 0;
  auVar4._0_4_ = metric.total_example_;
  auVar4._4_4_ = metric.true_pred_;
  auVar4 = vcvtudq2pd_avx512vl(auVar4);
  auVar1 = vshufpd_avx(auVar4,auVar4,1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"metric_val","(1.0 / 4.0)",(float)(auVar1._0_8_ / auVar4._0_8_),
             0.25);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  AccMetric::metric_type_abi_cxx11_((string *)&gtest_ar,&metric);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&gtest_ar_2,"metric.metric_type()","\"Accuarcy\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (char (*) [9])"Accuarcy");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pred.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&Y.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(RecallMetricTest, recall_test) {
  std::vector<real_t> Y;
  Y.push_back(1.0);
  Y.push_back(1.0);
  Y.push_back(-1.0);
  Y.push_back(-1.0);
  std::vector<real_t> pred;
  pred.push_back(100);
  pred.push_back(32);
  pred.push_back(12);
  pred.push_back(-21);
  RecallMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (2.0 / 2.0));
  metric.Reset();
  Y[0] = 1.0;
  Y[1] = -1.0;
  Y[2] = 1.0;
  Y[3] = -1.0;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = -12;
  pred[3] = -12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (1.0 / 2.0));
  EXPECT_EQ(metric.metric_type(), "Recall");
}